

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Dimension_UnknownDimension::Clear(Dimension_UnknownDimension *this)

{
  uint32_t cached_has_bits;
  Dimension_UnknownDimension *this_local;
  
  this->variadic_ = false;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Dimension_UnknownDimension::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.MILSpec.Dimension.UnknownDimension)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  variadic_ = false;
  _internal_metadata_.Clear<std::string>();
}